

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

bool __thiscall dmlc::JSONReader::NextObjectItem(JSONReader *this,string *out_key)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  pointer puVar4;
  size_t *psVar5;
  bool bVar6;
  int ch;
  LogCheckError _check_err;
  char local_1e5;
  int local_1e4;
  LogCheckError local_1e0;
  string local_1d8;
  LogMessageFatal local_1b8;
  
  if ((this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1] == 0) {
    while( true ) {
      iVar1 = std::istream::peek();
      psVar5 = &this->line_count_n_;
      if ((iVar1 == 10) || (psVar5 = &this->line_count_r_, iVar1 == 0xd)) {
        *psVar5 = *psVar5 + 1;
      }
      iVar2 = isspace(iVar1);
      if (iVar2 == 0) break;
      std::istream::get();
    }
    bVar6 = iVar1 != 0x7d;
    if (!bVar6) {
      std::istream::get();
      bVar6 = false;
    }
  }
  else {
    do {
      local_1e4 = std::istream::get();
      psVar5 = &this->line_count_n_;
      if ((local_1e4 == 10) || (psVar5 = &this->line_count_r_, local_1e4 == 0xd)) {
        *psVar5 = *psVar5 + 1;
      }
      iVar1 = isspace(local_1e4);
    } while (iVar1 != 0);
    bVar6 = false;
    if ((local_1e4 != -1) && (bVar6 = false, local_1e4 != 0x7d)) {
      local_1b8.log_stream_ = (ostringstream)0x2c;
      LogCheck_EQ<int,char>((dmlc *)&local_1e0,&local_1e4,(char *)&local_1b8);
      if (local_1e0.str != (string *)0x0) {
        LogMessageFatal::LogMessageFatal
                  (&local_1b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                   ,0x305);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"Check failed: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"ch == \',\'",9);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b8,((local_1e0.str)->_M_dataplus)._M_p,
                            (local_1e0.str)->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Error at",8);
        line_info_abi_cxx11_(&local_1d8,this);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,", JSON object expect \'}\' or \',\' \'",0x21);
        local_1e5 = (char)local_1e4;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1e5,1);
        local_1e5 = '\'';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1e5,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        LogMessageFatal::~LogMessageFatal(&local_1b8);
      }
      LogCheckError::~LogCheckError(&local_1e0);
      bVar6 = true;
    }
  }
  puVar4 = (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
  if (bVar6 == false) {
    (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar4;
  }
  else {
    *puVar4 = *puVar4 + 1;
    ReadString(this,out_key);
    do {
      iVar1 = std::istream::get();
      psVar5 = &this->line_count_n_;
      if ((iVar1 == 10) || (psVar5 = &this->line_count_r_, iVar1 == 0xd)) {
        *psVar5 = *psVar5 + 1;
      }
      iVar2 = isspace(iVar1);
    } while (iVar2 != 0);
    local_1b8.log_stream_ = (ostringstream)0x3a;
    local_1e4 = iVar1;
    LogCheck_EQ<int,char>((dmlc *)&local_1e0,&local_1e4,(char *)&local_1b8);
    if (local_1e0.str != (string *)0x0) {
      LogMessageFatal::LogMessageFatal
                (&local_1b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                 ,0x317);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"Check failed: ",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"ch == \':\'",9);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1b8,((local_1e0.str)->_M_dataplus)._M_p,
                          (local_1e0.str)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Error at",8);
      line_info_abi_cxx11_(&local_1d8,this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Expect \':\' but get \'",0x16);
      local_1e5 = (char)local_1e4;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1e5,1);
      local_1e5 = '\'';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1e5,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      LogMessageFatal::~LogMessageFatal(&local_1b8);
    }
    LogCheckError::~LogCheckError(&local_1e0);
  }
  return bVar6;
}

Assistant:

inline bool JSONReader::NextObjectItem(std::string *out_key) {
  bool next = true;
  if (scope_counter_.back() != 0) {
    int ch = NextNonSpace();
    if (ch == EOF) {
      next = false;
    } else if (ch == '}') {
      next = false;
    } else {
      CHECK_EQ(ch, ',')
          << "Error at" << line_info()
          << ", JSON object expect \'}\' or \',\' \'" << static_cast<char>(ch) << '\'';
    }
  } else {
    int ch = PeekNextNonSpace();
    if (ch == '}') {
      NextChar();
      next = false;
    }
  }
  if (!next) {
    scope_counter_.pop_back();
    return false;
  } else {
    scope_counter_.back() += 1;
    ReadString(out_key);
    int ch = NextNonSpace();
    CHECK_EQ(ch, ':')
        << "Error at" << line_info()
        << ", Expect \':\' but get \'" << static_cast<char>(ch) << '\'';
    return true;
  }
}